

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O0

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormalsGlobalScheme
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_> *paVar1;
  allocator<double> *this_00;
  allocator<OpenMesh::VectorT<double,_3>_> *paVar2;
  pointer *this_01;
  size_t *this_02;
  Scalar SVar3;
  ParameterSet *pPVar4;
  double dVar5;
  double dVar6;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *mesh_00;
  bool bVar7;
  int iVar8;
  Index IVar9;
  Index IVar10;
  BaseHandle *pBVar11;
  reference __x;
  reference pvVar12;
  size_type sVar13;
  reference pvVar14;
  double *pdVar15;
  Scalar *pSVar16;
  Scalar *pSVar17;
  FaceIter FVar18;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  GVar19;
  Transpose<Eigen::SparseMatrix<double,_0,_int>_> TVar20;
  solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  sVar21;
  int local_954;
  RowwiseReturnType RStack_950;
  int i_2;
  solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_948;
  undefined1 local_938 [8];
  MatrixX3d filtered_normals_matrix;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  int local_734;
  int local_730;
  int i_1;
  undefined1 local_728 [8];
  MatrixXd right_term;
  SparseMatrixBase<Eigen::Transpose<Eigen::SparseMatrix<double,_0,_int>_>_> local_6f8 [8];
  Nested local_6f0;
  double local_6e8;
  ScalarMultipleReturnType local_6e0;
  Type local_6c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_&>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
  local_660;
  undefined1 local_5f8 [8];
  SparseMatrix<double,_0,_int> coef_matrix;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>
  local_590;
  undefined1 local_538 [8];
  SparseMatrix<double,_0,_int> matrix;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  local_4f0;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  local_4e8;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  local_4e0;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  local_4d8;
  double local_4c8;
  Triplet<double,_int> local_4c0;
  Triplet<double,_int> local_4b0;
  double local_4a0;
  double weight;
  double local_480;
  double range_weight;
  double local_460;
  double spatial_weight;
  Point cj;
  undefined1 auStack_438 [8];
  Normal nj;
  int index_j;
  int i;
  double weight_sum;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  Point ci;
  undefined1 auStack_3d8 [8];
  Normal ni;
  int local_3b4;
  undefined1 auStack_3b0 [4];
  int index_i;
  value_handle local_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  FaceIter f_it;
  double sigma_s;
  int iter;
  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
  range_and_mean_normal;
  undefined1 local_348 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  guided_normals;
  undefined1 local_328 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  undefined1 local_308 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  undefined1 local_2e8 [8];
  vector<double,_std::allocator<double>_> face_area;
  undefined1 local_2c8 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_guided_neighbor;
  undefined1 local_2a8 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  double radius;
  SparseMatrix<double,_0,_int> identity_matrix;
  SparseMatrix<double,_0,_int> normalize_matrix;
  SparseMatrix<double,_0,_int> weight_matrix;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> weight_triple;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> coef_triple;
  FaceNeighborType face_neighbor_type;
  int local_170;
  allocator local_169;
  int vertex_iteration_number;
  double local_148;
  double smoothness;
  string local_138 [32];
  double local_118;
  double sigma_r;
  string local_108 [32];
  int local_e8;
  allocator local_e1;
  int normal_iteration_number;
  double local_c0;
  double multiple_sigma_s;
  string local_b0 [32];
  double local_90;
  double multiple_radius;
  string local_80 [35];
  bool local_5d [8];
  bool include_central_face;
  allocator local_49;
  string local_48 [36];
  int local_24;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *pvStack_20;
  int face_neighbor_index;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *filtered_normals_local;
  TriMesh *mesh_local;
  GuidedMeshNormalFiltering *this_local;
  
  pvStack_20 = filtered_normals;
  filtered_normals_local =
       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)mesh;
  mesh_local = (TriMesh *)this;
  iVar8 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))();
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,(long)iVar8);
  pPVar4 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Face Neighbor",&local_49);
  bVar7 = ParameterSet::getValue(pPVar4,(string *)local_48,&local_24);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (((bVar7 ^ 0xffU) & 1) == 0) {
    pPVar4 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_80,"include central face",(allocator *)((long)&multiple_radius + 7));
    bVar7 = ParameterSet::getValue(pPVar4,(string *)local_80,local_5d);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&multiple_radius + 7));
    if (((bVar7 ^ 0xffU) & 1) == 0) {
      pPVar4 = (this->super_MeshDenoisingBase).parameter_set_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,"Multiple(* avg face dis.)",(allocator *)((long)&multiple_sigma_s + 7));
      bVar7 = ParameterSet::getValue(pPVar4,(string *)local_b0,&local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&multiple_sigma_s + 7));
      if (((bVar7 ^ 0xffU) & 1) == 0) {
        pPVar4 = (this->super_MeshDenoisingBase).parameter_set_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&normal_iteration_number,"Multiple(* sigma_s)",&local_e1);
        bVar7 = ParameterSet::getValue(pPVar4,(string *)&normal_iteration_number,&local_c0);
        std::__cxx11::string::~string((string *)&normal_iteration_number);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        if (((bVar7 ^ 0xffU) & 1) == 0) {
          pPVar4 = (this->super_MeshDenoisingBase).parameter_set_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_108,"(Global)Normal Iteration Num.",(allocator *)((long)&sigma_r + 7));
          bVar7 = ParameterSet::getValue(pPVar4,(string *)local_108,&local_e8);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sigma_r + 7));
          if (((bVar7 ^ 0xffU) & 1) == 0) {
            pPVar4 = (this->super_MeshDenoisingBase).parameter_set_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_138,"sigma_r",(allocator *)((long)&smoothness + 7));
            bVar7 = ParameterSet::getValue(pPVar4,(string *)local_138,&local_118);
            std::__cxx11::string::~string(local_138);
            std::allocator<char>::~allocator((allocator<char> *)((long)&smoothness + 7));
            if (((bVar7 ^ 0xffU) & 1) == 0) {
              pPVar4 = (this->super_MeshDenoisingBase).parameter_set_;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&vertex_iteration_number,"smoothness",&local_169);
              bVar7 = ParameterSet::getValue(pPVar4,(string *)&vertex_iteration_number,&local_148);
              std::__cxx11::string::~string((string *)&vertex_iteration_number);
              std::allocator<char>::~allocator((allocator<char> *)&local_169);
              if (((bVar7 ^ 0xffU) & 1) == 0) {
                pPVar4 = (this->super_MeshDenoisingBase).parameter_set_;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&face_neighbor_type,"Vertex Iteration Num.",
                           (allocator *)
                           ((long)&coef_triple.
                                   super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                bVar7 = ParameterSet::getValue(pPVar4,(string *)&face_neighbor_type,&local_170);
                std::__cxx11::string::~string((string *)&face_neighbor_type);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&coef_triple.
                                   super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                if (((bVar7 ^ 0xffU) & 1) == 0) {
                  coef_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                       (uint)(local_24 == 0) * 2;
                  std::
                  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ::vector((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                            *)&weight_triple.
                               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ::vector((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                            *)&weight_matrix.m_data.m_allocatedSize);
                  IVar9 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                  IVar10 = (*(code *)(filtered_normals_local->
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[1].
                                     super_VectorDataT<double,_3>.values_[2])();
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)
                             &normalize_matrix.m_data.m_allocatedSize,IVar9,IVar10);
                  IVar9 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                  IVar10 = (*(code *)(filtered_normals_local->
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[1].
                                     super_VectorDataT<double,_3>.values_[2])();
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&identity_matrix.m_data.m_allocatedSize
                             ,IVar9,IVar10);
                  IVar9 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                  IVar10 = (*(code *)(filtered_normals_local->
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[1].
                                     super_VectorDataT<double,_3>.values_[2])();
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&radius,IVar9,IVar10);
                  Eigen::SparseMatrix<double,_0,_int>::setIdentity
                            ((SparseMatrix<double,_0,_int> *)&radius);
                  if ((FaceNeighborType)
                      coef_triple.
                      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage == kRadiusBased) {
                    all_face_neighbor.
                    super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)getRadius(this,local_90,(TriMesh *)filtered_normals_local);
                  }
                  iVar8 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                  paVar1 = (allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                            *)((long)&all_guided_neighbor.
                                      super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                  std::
                  allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                  ::allocator(paVar1);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)local_2a8,(long)iVar8,paVar1);
                  std::
                  allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                  ::~allocator((allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                                *)((long)&all_guided_neighbor.
                                          super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  getAllFaceNeighborGMNF
                            (this,(TriMesh *)filtered_normals_local,
                             (FaceNeighborType)
                             coef_triple.
                             super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (double)all_face_neighbor.
                                     super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (bool)(local_5d[0] & 1),
                             (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                              *)local_2a8);
                  iVar8 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                  paVar1 = (allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                            *)((long)&face_area.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                  std::
                  allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                  ::allocator(paVar1);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)local_2c8,(long)iVar8,paVar1);
                  std::
                  allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                  ::~allocator((allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                                *)((long)&face_area.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  getAllGuidedNeighborGMNF
                            (this,(TriMesh *)filtered_normals_local,
                             (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                              *)local_2c8);
                  MeshDenoisingBase::getFaceNormal
                            (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                             pvStack_20);
                  iVar8 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                  this_00 = (allocator<double> *)
                            ((long)&face_centroid.
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                  std::allocator<double>::allocator(this_00);
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)local_2e8,(long)iVar8,
                             this_00);
                  std::allocator<double>::~allocator
                            ((allocator<double> *)
                             ((long)&face_centroid.
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  iVar8 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                  paVar2 = (allocator<OpenMesh::VectorT<double,_3>_> *)
                           ((long)&previous_normals.
                                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                  std::allocator<OpenMesh::VectorT<double,_3>_>::allocator(paVar2);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)local_308,(long)iVar8,paVar2);
                  std::allocator<OpenMesh::VectorT<double,_3>_>::~allocator
                            ((allocator<OpenMesh::VectorT<double,_3>_> *)
                             ((long)&previous_normals.
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  iVar8 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                  paVar2 = (allocator<OpenMesh::VectorT<double,_3>_> *)
                           ((long)&guided_normals.
                                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                  std::allocator<OpenMesh::VectorT<double,_3>_>::allocator(paVar2);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)local_328,(long)iVar8,paVar2);
                  std::allocator<OpenMesh::VectorT<double,_3>_>::~allocator
                            ((allocator<OpenMesh::VectorT<double,_3>_> *)
                             ((long)&guided_normals.
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  iVar8 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                  paVar2 = (allocator<OpenMesh::VectorT<double,_3>_> *)
                           ((long)&range_and_mean_normal.
                                   super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                  std::allocator<OpenMesh::VectorT<double,_3>_>::allocator(paVar2);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)local_348,(long)iVar8,paVar2);
                  std::allocator<OpenMesh::VectorT<double,_3>_>::~allocator
                            ((allocator<OpenMesh::VectorT<double,_3>_> *)
                             ((long)&range_and_mean_normal.
                                     super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  iVar8 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                  std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>::allocator
                            ((allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_> *)
                             ((long)&sigma_s + 7));
                  std::
                  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                  ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                            *)&iter,(long)iVar8,
                           (allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_> *)
                           ((long)&sigma_s + 7));
                  std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>::~allocator
                            ((allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_> *)
                             ((long)&sigma_s + 7));
                  for (sigma_s._0_4_ = 0; sigma_s._0_4_ < local_e8;
                      sigma_s._0_4_ = sigma_s._0_4_ + 1) {
                    MeshDenoisingBase::getFaceCentroid
                              (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)local_308);
                    dVar5 = getSigmaS(this,local_c0,
                                      (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       *)local_308,(TriMesh *)filtered_normals_local);
                    MeshDenoisingBase::getFaceArea
                              (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                               (vector<double,_std::allocator<double>_> *)local_2e8);
                    MeshDenoisingBase::getFaceNormal
                              (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)local_328);
                    mesh_00 = filtered_normals_local;
                    std::
                    vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                    ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                              *)&f_it.hnd_,
                             (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                              *)&iter);
                    getGuidedNormals(this,(TriMesh *)mesh_00,
                                     (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                      *)local_2c8,
                                     (vector<double,_std::allocator<double>_> *)local_2e8,
                                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      *)local_328,
                                     (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                      *)&f_it.hnd_,
                                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      *)local_348);
                    std::
                    vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                    ::~vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                               *)&f_it.hnd_);
                    std::
                    vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                    ::clear((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                             *)&weight_triple.
                                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::
                    vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                    ::clear((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                             *)&weight_matrix.m_data.m_allocatedSize);
                    FVar18 = OpenMesh::PolyConnectivity::faces_begin
                                       ((PolyConnectivity *)filtered_normals_local);
                    GVar19 = local_4d8;
                    while( true ) {
                      f_it.mesh_ = FVar18._8_8_;
                      local_3a0 = (undefined1  [8])FVar18.mesh_;
                      local_4d8 = GVar19;
                      FVar18 = OpenMesh::PolyConnectivity::faces_end
                                         ((PolyConnectivity *)filtered_normals_local);
                      _auStack_3b0 = FVar18;
                      bVar7 = OpenMesh::Iterators::
                              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                              ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                            *)local_3a0,
                                           (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                            *)auStack_3b0);
                      if (!bVar7) break;
                      pBVar11 = &OpenMesh::Iterators::
                                 GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                 ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                               *)local_3a0)->super_BaseHandle;
                      local_3b4 = OpenMesh::BaseHandle::idx(pBVar11);
                      pvVar14 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              *)local_348,(long)local_3b4);
                      ni.super_VectorDataT<double,_3>.values_[1] =
                           (pvVar14->super_VectorDataT<double,_3>).values_[2];
                      auStack_3d8 = (undefined1  [8])
                                    (pvVar14->super_VectorDataT<double,_3>).values_[0];
                      ni.super_VectorDataT<double,_3>.values_[0] =
                           (pvVar14->super_VectorDataT<double,_3>).values_[1];
                      pvVar14 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              *)local_308,(long)local_3b4);
                      face_neighbor.
                      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)(pvVar14->super_VectorDataT<double,_3>).values_[0];
                      __x = std::
                            vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            ::operator[]((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                          *)local_2a8,(long)local_3b4);
                      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                      vector((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                             &weight_sum,__x);
                      _index_j = 0.0;
                      nj.super_VectorDataT<double,_3>.values_[2]._4_4_ = 0;
                      while( true ) {
                        iVar8 = nj.super_VectorDataT<double,_3>.values_[2]._4_4_;
                        sVar13 = std::
                                 vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                 ::size((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                         *)&weight_sum);
                        if ((int)sVar13 <= iVar8) break;
                        pBVar11 = &std::
                                   vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   ::operator[]((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                                 *)&weight_sum,
                                                (long)nj.super_VectorDataT<double,_3>.values_[2].
                                                      _4_4_)->super_BaseHandle;
                        nj.super_VectorDataT<double,_3>.values_[2]._0_4_ =
                             OpenMesh::BaseHandle::idx(pBVar11);
                        pvVar14 = std::
                                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                                *)local_348,
                                               (long)nj.super_VectorDataT<double,_3>.values_[2].
                                                     _0_4_);
                        nj.super_VectorDataT<double,_3>.values_[1] =
                             (pvVar14->super_VectorDataT<double,_3>).values_[2];
                        auStack_438 = (undefined1  [8])
                                      (pvVar14->super_VectorDataT<double,_3>).values_[0];
                        nj.super_VectorDataT<double,_3>.values_[0] =
                             (pvVar14->super_VectorDataT<double,_3>).values_[1];
                        pvVar14 = std::
                                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                                *)local_308,
                                               (long)nj.super_VectorDataT<double,_3>.values_[2].
                                                     _0_4_);
                        cj.super_VectorDataT<double,_3>.values_[1] =
                             (pvVar14->super_VectorDataT<double,_3>).values_[2];
                        spatial_weight = (pvVar14->super_VectorDataT<double,_3>).values_[0];
                        cj.super_VectorDataT<double,_3>.values_[0] =
                             (pvVar14->super_VectorDataT<double,_3>).values_[1];
                        OpenMesh::VectorT<double,_3>::operator-
                                  ((vector_type *)&range_weight,
                                   (VectorT<double,_3> *)
                                   &face_neighbor.
                                    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (vector_type *)&spatial_weight);
                        dVar6 = OpenMesh::VectorT<double,_3>::length
                                          ((VectorT<double,_3> *)&range_weight);
                        local_460 = GaussianWeight(this,dVar6,dVar5);
                        OpenMesh::VectorT<double,_3>::operator-
                                  ((vector_type *)&weight,(VectorT<double,_3> *)auStack_3d8,
                                   (vector_type *)auStack_438);
                        dVar6 = OpenMesh::VectorT<double,_3>::length((VectorT<double,_3> *)&weight);
                        local_480 = GaussianWeight(this,dVar6,local_118);
                        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                            ((vector<double,_std::allocator<double>_> *)local_2e8,
                                             (long)nj.super_VectorDataT<double,_3>.values_[2]._0_4_)
                        ;
                        local_4a0 = *pvVar12 * local_460 * local_480;
                        Eigen::Triplet<double,_int>::Triplet
                                  (&local_4b0,&local_3b4,
                                   (int *)(nj.super_VectorDataT<double,_3>.values_ + 2),&local_4a0);
                        std::
                        vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                        ::push_back((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                     *)&weight_triple.
                                        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_4b0);
                        _index_j = local_4a0 + _index_j;
                        nj.super_VectorDataT<double,_3>.values_[2]._4_4_ =
                             nj.super_VectorDataT<double,_3>.values_[2]._4_4_ + 1;
                      }
                      local_4c8 = 1.0 / _index_j;
                      Eigen::Triplet<double,_int>::Triplet
                                (&local_4c0,&local_3b4,&local_3b4,&local_4c8);
                      std::
                      vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                      ::push_back((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   *)&weight_matrix.m_data.m_allocatedSize,&local_4c0);
                      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                      ~vector((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *
                              )&weight_sum);
                      GVar19 = OpenMesh::Iterators::
                               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                               ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                             *)local_3a0,0);
                      FVar18._8_8_ = f_it.mesh_;
                      FVar18.mesh_ = (mesh_ptr)local_3a0;
                    }
                    this_01 = &weight_triple.
                               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_4e0._M_current =
                         (Triplet<double,_int> *)
                         std::
                         vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                         ::begin((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                  *)this_01);
                    local_4e8._M_current =
                         (Triplet<double,_int> *)
                         std::
                         vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                         ::end((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                *)this_01);
                    Eigen::SparseMatrix<double,0,int>::
                    setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
                              ((SparseMatrix<double,0,int> *)
                               &normalize_matrix.m_data.m_allocatedSize,&local_4e0,&local_4e8);
                    this_02 = &weight_matrix.m_data.m_allocatedSize;
                    local_4f0._M_current =
                         (Triplet<double,_int> *)
                         std::
                         vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                         ::begin((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                  *)this_02);
                    matrix.m_data.m_allocatedSize =
                         (size_t)std::
                                 vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                 ::end((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                        *)this_02);
                    Eigen::SparseMatrix<double,0,int>::
                    setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
                              ((SparseMatrix<double,0,int> *)&identity_matrix.m_data.m_allocatedSize
                               ,&local_4f0,
                               (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                *)&matrix.m_data.m_allocatedSize);
                    Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::operator*
                              ((Type *)&coef_matrix.m_data.m_allocatedSize,
                               (SparseMatrixBase<Eigen::SparseMatrix<double,0,int>> *)
                               &identity_matrix.m_data.m_allocatedSize,
                               (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                               &normalize_matrix.m_data.m_allocatedSize);
                    Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::operator-
                              (&local_590,
                               (SparseMatrixBase<Eigen::SparseMatrix<double,0,int>> *)&radius,
                               (SparseMatrixBase<Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>
                                *)&coef_matrix.m_data.m_allocatedSize);
                    Eigen::SparseMatrix<double,0,int>::
                    SparseMatrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::SparseMatrix<double,0,int>const,Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,0,int>const&,Eigen::SparseMatrix<double,0,int>const&>const>>
                              ((SparseMatrix<double,0,int> *)local_538,
                               (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>_>
                                *)&local_590);
                    Eigen::
                    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>
                    ::~CwiseBinaryOp(&local_590);
                    local_6e8 = 1.0 - local_148;
                    TVar20 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>::
                             transpose((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                                       local_538);
                    local_6f0 = TVar20.m_matrix;
                    local_6f8[0].m_isRValue =
                         (bool)TVar20.
                               super_TransposeImpl<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Sparse>
                               .
                               super_SparseMatrixBase<Eigen::Transpose<Eigen::SparseMatrix<double,_0,_int>_>_>
                               .m_isRValue;
                    Eigen::operator*(&local_6e0,&local_6e8,local_6f8);
                    Eigen::
                    SparseMatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Transpose<Eigen::SparseMatrix<double,0,int>>const>>
                    ::operator*(&local_6c0,
                                (SparseMatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Transpose<Eigen::SparseMatrix<double,0,int>>const>>
                                 *)&local_6e0,
                                (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)local_538)
                    ;
                    Eigen::operator*((ScalarMultipleReturnType *)
                                     &right_term.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_cols,&local_148,(StorageBaseType *)&radius);
                    Eigen::
                    SparseMatrixBase<Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>>
                    ::operator+(&local_660,
                                (SparseMatrixBase<Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>>
                                 *)&local_6c0,
                                (SparseMatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
                                 *)&right_term.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols);
                    Eigen::SparseMatrix<double,0,int>::
                    SparseMatrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::SparseMatrix<double,0,int>const>const>>
                              ((SparseMatrix<double,0,int> *)local_5f8,
                               (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_&>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>_>
                                *)&local_660);
                    Eigen::
                    CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_&>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
                    ::~CwiseBinaryOp(&local_660);
                    Eigen::
                    SparseSparseProduct<Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_&>
                    ::~SparseSparseProduct(&local_6c0);
                    i_1 = (*(code *)(filtered_normals_local->
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super_VectorDataT<double,_3>.values_[2])();
                    local_730 = 3;
                    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
                              ((Matrix<double,_1,_1,0,_1,_1> *)local_728,&i_1,&local_730);
                    local_734 = 0;
                    while( true ) {
                      sVar13 = std::
                               vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ::size((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       *)local_328);
                      if ((int)sVar13 <= local_734) break;
                      pvVar14 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              *)local_328,(long)local_734);
                      pdVar15 = OpenMesh::VectorT<double,_3>::operator[](pvVar14,0);
                      dVar5 = *pdVar15;
                      pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>
                                ::operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                                              *)local_728,(long)local_734,0);
                      *pSVar16 = dVar5;
                      pvVar14 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              *)local_328,(long)local_734);
                      pdVar15 = OpenMesh::VectorT<double,_3>::operator[](pvVar14,1);
                      dVar5 = *pdVar15;
                      pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>
                                ::operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                                              *)local_728,(long)local_734,1);
                      *pSVar16 = dVar5;
                      pvVar14 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              *)local_328,(long)local_734);
                      pdVar15 = OpenMesh::VectorT<double,_3>::operator[](pvVar14,2);
                      dVar5 = *pdVar15;
                      pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>
                                ::operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                                              *)local_728,(long)local_734,2);
                      *pSVar16 = dVar5;
                      local_734 = local_734 + 1;
                    }
                    Eigen::operator*((Eigen *)&solver.m_detPermR,&local_148,
                                     (StorageBaseType *)local_728);
                    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                              ((Matrix<double,_1,_1,0,_1,_1> *)local_728,
                               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                *)&solver.m_detPermR);
                    Eigen::
                    SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                    SparseLU((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                              *)&filtered_normals_matrix.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
                                 m_storage.m_rows);
                    Eigen::
                    SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                    analyzePattern((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                                    *)&filtered_normals_matrix.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>
                                       .m_storage.m_rows,(MatrixType *)local_5f8);
                    Eigen::
                    SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                    factorize((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                               *)&filtered_normals_matrix.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
                                  m_storage.m_rows,(MatrixType *)local_5f8);
                    sVar21 = (solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              )Eigen::
                               SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>
                               ::solve<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                         ((SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>
                                           *)&filtered_normals_matrix.
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>
                                              .m_storage.m_rows,
                                          (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                          local_728);
                    local_948 = sVar21;
                    Eigen::Matrix<double,-1,3,0,-1,3>::
                    Matrix<Eigen::internal::solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                              ((Matrix<double,_1,3,0,_1,3> *)local_938,
                               (ReturnByValue<Eigen::internal::solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                *)&local_948);
                    RStack_950 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::rowwise
                                           ((DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)
                                            local_938);
                    Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::normalize
                              (&stack0xfffffffffffff6b0);
                    local_954 = 0;
                    while( true ) {
                      sVar13 = std::
                               vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ::size(pvStack_20);
                      if ((int)sVar13 <= local_954) break;
                      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::
                                operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1>
                                            *)local_938,(long)local_954,0);
                      SVar3 = *pSVar17;
                      pvVar14 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[](pvStack_20,(long)local_954);
                      pdVar15 = OpenMesh::VectorT<double,_3>::operator[](pvVar14,0);
                      *pdVar15 = SVar3;
                      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::
                                operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1>
                                            *)local_938,(long)local_954,1);
                      SVar3 = *pSVar17;
                      pvVar14 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[](pvStack_20,(long)local_954);
                      pdVar15 = OpenMesh::VectorT<double,_3>::operator[](pvVar14,1);
                      *pdVar15 = SVar3;
                      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::
                                operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1>
                                            *)local_938,(long)local_954,2);
                      SVar3 = *pSVar17;
                      pvVar14 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[](pvStack_20,(long)local_954);
                      pdVar15 = OpenMesh::VectorT<double,_3>::operator[](pvVar14,2);
                      *pdVar15 = SVar3;
                      local_954 = local_954 + 1;
                    }
                    MeshDenoisingBase::updateVertexPosition
                              (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                               pvStack_20,local_170,false);
                    Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::~Matrix
                              ((Matrix<double,__1,_3,_0,__1,_3> *)local_938);
                    Eigen::
                    SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                    ~SparseLU((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                               *)&filtered_normals_matrix.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
                                  m_storage.m_rows);
                    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                              ((Matrix<double,__1,__1,_0,__1,__1> *)local_728);
                    Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                              ((SparseMatrix<double,_0,_int> *)local_5f8);
                    Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                              ((SparseMatrix<double,_0,_int> *)local_538);
                  }
                  std::
                  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                  ::~vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                             *)&iter);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             *)local_348);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             *)local_328);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             *)local_308);
                  std::vector<double,_std::allocator<double>_>::~vector
                            ((vector<double,_std::allocator<double>_> *)local_2e8);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             *)local_2c8);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             *)local_2a8);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&radius);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&identity_matrix.m_data.m_allocatedSize
                            );
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)
                             &normalize_matrix.m_data.m_allocatedSize);
                  std::
                  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ::~vector((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                             *)&weight_matrix.m_data.m_allocatedSize);
                  std::
                  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ::~vector((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                             *)&weight_triple.
                                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormalsGlobalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize((int)mesh.n_faces());

    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    bool include_central_face;
    if(!parameter_set_->getValue(string("include central face"), include_central_face))
        return;
    double multiple_radius;
    if(!parameter_set_->getValue(string("Multiple(* avg face dis.)"), multiple_radius))
        return;
    double multiple_sigma_s;
    if(!parameter_set_->getValue(string("Multiple(* sigma_s)"), multiple_sigma_s))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("(Global)Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_r;
    if(!parameter_set_->getValue(string("sigma_r"), sigma_r))
        return;
    double smoothness;
    if(!parameter_set_->getValue(string("smoothness"), smoothness))
        return;
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = face_neighbor_index == 0 ? kRadiusBased : kVertexBased;

    std::vector< Eigen::Triplet<double> > coef_triple;
    std::vector< Eigen::Triplet<double> > weight_triple;
    Eigen::SparseMatrix<double> weight_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    Eigen::SparseMatrix<double> normalize_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    Eigen::SparseMatrix<double> identity_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    identity_matrix.setIdentity();

    double radius;
    if(face_neighbor_type == kRadiusBased)
        radius = getRadius(multiple_radius, mesh);

    std::vector<std::vector<TriMesh::FaceHandle> > all_face_neighbor((int)mesh.n_faces());
    getAllFaceNeighborGMNF(mesh, face_neighbor_type, radius, include_central_face, all_face_neighbor);
    std::vector<std::vector<TriMesh::FaceHandle> > all_guided_neighbor((int)mesh.n_faces());
    getAllGuidedNeighborGMNF(mesh, all_guided_neighbor);
    getFaceNormal(mesh, filtered_normals);

    std::vector<double> face_area((int)mesh.n_faces());
    std::vector<TriMesh::Point> face_centroid((int)mesh.n_faces());
    std::vector<TriMesh::Normal> previous_normals((int)mesh.n_faces());
    std::vector<TriMesh::Normal> guided_normals((int)mesh.n_faces());
    std::vector<std::pair<double, TriMesh::Normal> > range_and_mean_normal((int)mesh.n_faces());
    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        getFaceCentroid(mesh, face_centroid);
        double sigma_s = getSigmaS(multiple_sigma_s, face_centroid, mesh);
        getFaceArea(mesh, face_area);
        getFaceNormal(mesh, previous_normals);

        getGuidedNormals(mesh, all_guided_neighbor, face_area, previous_normals, range_and_mean_normal, guided_normals);

        // construct matrix
        coef_triple.clear();
        weight_triple.clear();

        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index_i = f_it->idx();
            TriMesh::Normal ni = guided_normals[index_i];
            TriMesh::Point ci = face_centroid[index_i];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index_i];            
            double weight_sum = 0.0;
            for(int i = 0; i < (int)face_neighbor.size(); i++)
            {
                int index_j = face_neighbor[i].idx();
                TriMesh::Normal nj = guided_normals[index_j];
                TriMesh::Point cj = face_centroid[index_j];
                double spatial_weight = GaussianWeight((ci - cj).length(), sigma_s);
                double range_weight = GaussianWeight((ni - nj).length(), sigma_r);
                double weight = face_area[index_j] * spatial_weight * range_weight;
                coef_triple.push_back( Eigen::Triplet<double>(index_i, index_j, weight) );
                weight_sum += weight;
            }
            weight_triple.push_back( Eigen::Triplet<double>(index_i, index_i , 1.0 / weight_sum) );
        }
        weight_matrix.setFromTriplets(coef_triple.begin(), coef_triple.end());
        normalize_matrix.setFromTriplets(weight_triple.begin(), weight_triple.end());
        Eigen::SparseMatrix<double> matrix = identity_matrix - normalize_matrix * weight_matrix;
        Eigen::SparseMatrix<double> coef_matrix = (1 - smoothness) * matrix.transpose() * matrix + smoothness * identity_matrix;

        // construct right term
        Eigen::MatrixXd right_term((int)mesh.n_faces(), 3);
        for(int i = 0; i < (int)previous_normals.size(); i++)
        {
            right_term(i, 0) = previous_normals[i][0];
            right_term(i, 1) = previous_normals[i][1];
            right_term(i, 2) = previous_normals[i][2];
        }
        right_term = smoothness * right_term;

        // solve Ax = b
        Eigen::SparseLU<Eigen::SparseMatrix<double> > solver;
        solver.analyzePattern(coef_matrix);
        solver.factorize(coef_matrix);
        Eigen::MatrixX3d filtered_normals_matrix = solver.solve(right_term);
        filtered_normals_matrix.rowwise().normalize();
        for(int i = 0; i < (int)filtered_normals.size(); i++)
        {
            filtered_normals[i][0] = filtered_normals_matrix(i, 0);
            filtered_normals[i][1] = filtered_normals_matrix(i, 1);
            filtered_normals[i][2] = filtered_normals_matrix(i, 2);
        }
        // immediate update vertex position
        updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, false);
    }
}